

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.h
# Opt level: O2

void __thiscall QLineEditPrivate::~QLineEditPrivate(QLineEditPrivate *this)

{
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QLineEditPrivate_007ce528;
  std::
  _Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  ::~_Vector_base(&(this->trailingSideWidgets).
                   super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                 );
  std::
  _Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  ::~_Vector_base(&(this->leadingSideWidgets).
                   super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                 );
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->placeholderText).d);
  QBasicTimer::~QBasicTimer(&this->dndTimer);
  QBasicTimer::~QBasicTimer(&this->tripleClickTimer);
  QWeakPointer<QObject>::~QWeakPointer(&(this->selectAllAction).wp);
  QWidgetPrivate::~QWidgetPrivate(&this->super_QWidgetPrivate);
  return;
}

Assistant:

~QLineEditPrivate()
    {
    }